

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

bool caffe::SolverParameter_SnapshotFormat_IsValid(int value)

{
  int value_local;
  
  return (uint)value < 2;
}

Assistant:

bool SolverParameter_SnapshotFormat_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
      return true;
    default:
      return false;
  }
}